

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O3

EndpointInfo * __thiscall
helics::InterfaceInfo::getEndpoint(InterfaceInfo *this,InterfaceHandle handle)

{
  shared_mutex *__rwlock;
  const_iterator cVar1;
  _Head_base<0UL,_helics::EndpointInfo_*,_false> _Var2;
  key_type local_1c;
  
  __rwlock = &(this->endpoints).m_mutex;
  local_1c.hid = handle.hid;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  cVar1 = std::
          _Hashtable<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::InterfaceHandle>,_std::hash<helics::InterfaceHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->endpoints).m_obj.lookup2._M_h,&local_1c);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false>.
      _M_cur == (__node_type *)0x0) {
    _Var2._M_head_impl = (EndpointInfo *)0x0;
  }
  else {
    _Var2._M_head_impl =
         *(EndpointInfo **)
          &(this->endpoints).m_obj.dataStorage.
           super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [*(long *)((long)cVar1.
                            super__Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false>
                            ._M_cur + 0x10)]._M_t;
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return (EndpointInfo *)
         (tuple<helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>)
         _Var2._M_head_impl;
}

Assistant:

const EndpointInfo* InterfaceInfo::getEndpoint(InterfaceHandle handle) const
{
    return endpoints.lock_shared()->find(handle);
}